

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t createTagString(char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region
                       ,int32_t regionLength,char *trailing,int32_t trailingLength,char *tag,
                       int32_t tagCapacity,UErrorCode *err)

{
  int32_t iVar1;
  
  iVar1 = createTagStringWithAlternates
                    (lang,langLength,script,scriptLength,region,regionLength,trailing,trailingLength
                     ,(char *)0x0,tag,tagCapacity,err);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
createTagString(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* trailing,
    int32_t trailingLength,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err)
{
    return createTagStringWithAlternates(
                lang,
                langLength,
                script,
                scriptLength,
                region,
                regionLength,
                trailing,
                trailingLength,
                NULL,
                tag,
                tagCapacity,
                err);
}